

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O3

void __thiscall icu_63::UnifiedCache::~UnifiedCache(UnifiedCache *this)

{
  (this->super_UnifiedCacheBase).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnifiedCache_003b1ff0;
  flush(this);
  umtx_lock_63(&gCacheMutex);
  _flush(this,'\x01');
  umtx_unlock_63(&gCacheMutex);
  uhash_close_63(this->fHashtable);
  this->fHashtable = (UHashtable *)0x0;
  if (this->fNoValue != (SharedObject *)0x0) {
    (*(this->fNoValue->super_UObject)._vptr_UObject[1])();
  }
  this->fNoValue = (SharedObject *)0x0;
  UnifiedCacheBase::~UnifiedCacheBase(&this->super_UnifiedCacheBase);
  return;
}

Assistant:

UnifiedCache::~UnifiedCache() {
    // Try our best to clean up first.
    flush();
    {
        // Now all that should be left in the cache are entries that refer to
        // each other and entries with hard references from outside the cache.
        // Nothing we can do about these so proceed to wipe out the cache.
        Mutex lock(&gCacheMutex);
        _flush(TRUE);
    }
    uhash_close(fHashtable);
    fHashtable = nullptr;
    delete fNoValue;
    fNoValue = nullptr;
}